

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::Key(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
      *this,Context *context,Ch *str,SizeType len,bool param_4)

{
  uint uVar1;
  RegexType *pattern;
  bool bVar2;
  Ch *pCVar3;
  SchemaType *pSVar4;
  ValueType *this_00;
  Ch *pCVar5;
  long lVar6;
  ulong uVar7;
  SizeType index;
  SizeType local_4c;
  Data local_48;
  
  if ((this->patternProperties_ != (PatternProperty *)0x0) &&
     (context->patternPropertiesSchemaCount = 0, this->patternPropertyCount_ != 0)) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      pattern = *(RegexType **)((long)&this->patternProperties_->pattern + lVar6);
      if ((pattern != (RegexType *)0x0) && (bVar2 = IsPatternMatch(pattern,str,len), bVar2)) {
        pSVar4 = *(SchemaType **)((long)&this->patternProperties_->schema + lVar6);
        uVar1 = context->patternPropertiesSchemaCount;
        context->patternPropertiesSchemaCount = uVar1 + 1;
        context->patternPropertiesSchemas[uVar1] = pSVar4;
        context->valueSchema = this->typeless_;
      }
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar7 < this->patternPropertyCount_);
  }
  local_4c = 0;
  local_48.n = (Number)0x0;
  local_48.s.str = (Ch *)0x0;
  if (len != 0 && str == (Ch *)0x0) {
    __assert_fail("str != 0 || len == 0u",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                  ,0x19c,
                  "rapidjson::GenericStringRef<char>::GenericStringRef(const CharType *, SizeType) [CharType = char]"
                 );
  }
  pCVar3 = "";
  if (str != (Ch *)0x0) {
    pCVar3 = str;
  }
  local_48.s.str = (Ch *)((ulong)pCVar3 | 0x405000000000000);
  local_48.s.hashcode = 0;
  local_48.s.length = len;
  bVar2 = FindPropertyIndex(this,(ValueType *)&local_48.s,&local_4c);
  if (!bVar2) {
    pSVar4 = this->additionalPropertiesSchema_;
    if (pSVar4 == (SchemaType *)0x0) {
      if (this->additionalProperties_ != true) {
        if (context->patternPropertiesSchemaCount == 0) {
          context->valueSchema = this->typeless_;
          (*context->error_handler->_vptr_IValidationErrorHandler[0x18])
                    (context->error_handler,str,(ulong)len);
          context->invalidCode = kValidateErrorAdditionalProperties;
          this_00 = GetAdditionalPropertiesString();
          pCVar5 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::GetString(this_00);
          context->invalidKeyword = pCVar5;
          return false;
        }
        return true;
      }
      pSVar4 = this->typeless_;
    }
    else {
      uVar1 = context->patternPropertiesSchemaCount;
      if ((ulong)uVar1 != 0) {
        context->patternPropertiesSchemaCount = uVar1 + 1;
        context->patternPropertiesSchemas[uVar1] = pSVar4;
        context->valueSchema = this->typeless_;
        context->valuePatternValidatorType = kPatternValidatorWithAdditionalProperty;
        return true;
      }
    }
    context->valueSchema = pSVar4;
    return true;
  }
  uVar1 = context->patternPropertiesSchemaCount;
  pSVar4 = this->properties_[local_4c].schema;
  if ((ulong)uVar1 == 0) {
    context->valueSchema = pSVar4;
  }
  else {
    context->patternPropertiesSchemaCount = uVar1 + 1;
    context->patternPropertiesSchemas[uVar1] = pSVar4;
    context->valueSchema = this->typeless_;
    context->valuePatternValidatorType = kPatternValidatorWithProperty;
  }
  if (context->propertyExist != (bool *)0x0) {
    context->propertyExist[local_4c] = true;
    return true;
  }
  return true;
}

Assistant:

bool Key(Context& context, const Ch* str, SizeType len, bool) const {
        RAPIDJSON_SCHEMA_PRINT(Method, "Schema::Key", str);

        if (patternProperties_) {
            context.patternPropertiesSchemaCount = 0;
            for (SizeType i = 0; i < patternPropertyCount_; i++)
                if (patternProperties_[i].pattern && IsPatternMatch(patternProperties_[i].pattern, str, len)) {
                    context.patternPropertiesSchemas[context.patternPropertiesSchemaCount++] = patternProperties_[i].schema;
                    context.valueSchema = typeless_;
                }
        }

        SizeType index  = 0;
        if (FindPropertyIndex(ValueType(str, len).Move(), &index)) {
            if (context.patternPropertiesSchemaCount > 0) {
                context.patternPropertiesSchemas[context.patternPropertiesSchemaCount++] = properties_[index].schema;
                context.valueSchema = typeless_;
                context.valuePatternValidatorType = Context::kPatternValidatorWithProperty;
            }
            else
                context.valueSchema = properties_[index].schema;

            if (context.propertyExist)
                context.propertyExist[index] = true;

            return true;
        }

        if (additionalPropertiesSchema_) {
            if (context.patternPropertiesSchemaCount > 0) {
                context.patternPropertiesSchemas[context.patternPropertiesSchemaCount++] = additionalPropertiesSchema_;
                context.valueSchema = typeless_;
                context.valuePatternValidatorType = Context::kPatternValidatorWithAdditionalProperty;
            }
            else
                context.valueSchema = additionalPropertiesSchema_;
            return true;
        }
        else if (additionalProperties_) {
            context.valueSchema = typeless_;
            return true;
        }

        if (context.patternPropertiesSchemaCount == 0) { // patternProperties are not additional properties
            // Must set valueSchema for when kValidateContinueOnErrorFlag is set, else reports spurious type error
            context.valueSchema = typeless_;
            context.error_handler.DisallowedProperty(str, len);
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorAdditionalProperties);
        }

        return true;
    }